

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void VP8LHistogramStoreRefs(VP8LBackwardRefs *refs,VP8LHistogram *histo)

{
  int iVar1;
  VP8LBackwardRefs *in_RDI;
  VP8LRefsCursor c;
  VP8LRefsCursor local_28;
  
  VP8LRefsCursorInit(&local_28,in_RDI);
  while( true ) {
    iVar1 = VP8LRefsCursorOk(&local_28);
    if (iVar1 == 0) break;
    VP8LHistogramAddSinglePixOrCopy
              ((VP8LHistogram *)refs,(PixOrCopy *)histo,(_func_int_int_int *)c.last_pos_,
               c.cur_block_._4_4_);
    VP8LRefsCursorNext((VP8LRefsCursor *)0x19a314);
  }
  return;
}

Assistant:

void VP8LHistogramStoreRefs(const VP8LBackwardRefs* const refs,
                            VP8LHistogram* const histo) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    VP8LHistogramAddSinglePixOrCopy(histo, c.cur_pos, NULL, 0);
    VP8LRefsCursorNext(&c);
  }
}